

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O0

void __thiscall spatial_region::update_energy_deleted(spatial_region *this,particle *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int j;
  double norm;
  particle *a_local;
  spatial_region *this_local;
  
  auVar1._0_8_ = (this->dx * 8.2e-14 * this->dy * this->dz * 11148500000000.0 * lambda) /
                 248.05021344239853;
  if ((a->cmr != -1.0) || (NAN(a->cmr))) {
    if ((a->cmr != 1.0) || (NAN(a->cmr))) {
      if ((a->cmr != 0.0) || (NAN(a->cmr))) {
        for (j = 0; j < this->n_ion_populations; j = j + 1) {
          if ((a->cmr == this->icmr[j]) && (!NAN(a->cmr) && !NAN(this->icmr[j]))) {
            this->ienergy_deleted[j] =
                 (a->q * (a->g - 1.0) * auVar1._0_8_) / this->icmr[j] + this->ienergy_deleted[j];
            return;
          }
        }
      }
      else {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auVar1._0_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->energy_ph_deleted;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = a->q * a->g;
        auVar1 = vfmadd213sd_fma(auVar3,auVar6,auVar9);
        this->energy_ph_deleted = auVar1._0_8_;
      }
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = auVar1._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = this->energy_p_deleted;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = a->q * (a->g - 1.0);
      auVar1 = vfmadd213sd_fma(auVar2,auVar5,auVar8);
      this->energy_p_deleted = auVar1._0_8_;
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this->energy_e_deleted;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = -(a->q * (a->g - 1.0));
    auVar1 = vfmadd213sd_fma(auVar1,auVar4,auVar7);
    this->energy_e_deleted = auVar1._0_8_;
  }
  return;
}

Assistant:

void spatial_region::update_energy_deleted(particle* a)
{
    double norm = 8.2e-14*dx*dy*dz*1.11485e13*lambda/(8*PI*PI*PI); // energy in Joules
    if (a->cmr == -1)
    {
        spatial_region::energy_e_deleted -= a->q * (a->g - 1) * norm; // energy should be positive in file
    }
    else if (a->cmr == 1)
    {
        spatial_region::energy_p_deleted += a->q * (a->g - 1) * norm;
    }
    else if (a->cmr == 0)
    {
        spatial_region::energy_ph_deleted += a->q * a->g * norm;
    }
    else
    {
        for (int j=0; j<n_ion_populations; ++j)
        {
            if (a->cmr == icmr[j])
            {
                spatial_region::ienergy_deleted[j] += a->q * (a->g - 1) * norm / icmr[j];
                break;
            }
        }
    }
}